

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockComparatorCopierTest.cpp
# Opt level: O0

void __thiscall
TEST_MockComparatorCopierTest_customObjectWithFunctionComparator_TestShell::
TEST_MockComparatorCopierTest_customObjectWithFunctionComparator_TestShell
          (TEST_MockComparatorCopierTest_customObjectWithFunctionComparator_TestShell *this)

{
  TEST_MockComparatorCopierTest_customObjectWithFunctionComparator_TestShell *this_local;
  
  UtestShell::UtestShell(&this->super_UtestShell);
  (this->super_UtestShell)._vptr_UtestShell =
       (_func_int **)
       &PTR__TEST_MockComparatorCopierTest_customObjectWithFunctionComparator_TestShell_00332458;
  return;
}

Assistant:

TEST(MockComparatorCopierTest, customObjectWithFunctionComparator)
{
    MyTypeForTesting object(1);
    MockFunctionComparator comparator(myTypeIsEqual, myTypeValueToString);
    mock().installComparator("MyTypeForTesting", comparator);

    mock().expectOneCall("function").withParameterOfType("MyTypeForTesting", "parameterName", &object);
    mock().actualCall("function").withParameterOfType("MyTypeForTesting", "parameterName", &object);

    mock().checkExpectations();

    mock().removeAllComparatorsAndCopiers();
}